

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFParser.cpp
# Opt level: O0

EStatusCode __thiscall
PDFParser::ParseXrefFromXrefStream
          (PDFParser *this,XrefEntryInputVector *inXrefTable,ObjectIDType inXrefSize,
          PDFStreamInput *inXrefStream,ObjectIDType *outReadTableSize)

{
  PDFArray **this_00;
  ObjectIDType inSegmentCount;
  undefined1 auVar1 [16];
  ObjectIDType inSegmentStartObject;
  bool bVar2;
  EPDFObjectType EVar3;
  IByteReader *inReadFrom;
  PDFDictionary *pPVar4;
  PDFObject *pPVar5;
  PDFArray *pPVar6;
  unsigned_long uVar7;
  ulong uVar8;
  PDFInteger *pPVar9;
  longlong lVar10;
  LongFilePositionType inPosition;
  PDFObject **inSegmentCount_00;
  value_type pPVar11;
  Trace *pTVar12;
  unsigned_long *puVar13;
  unsigned_long local_170;
  PDFStreamInput *local_168;
  ObjectIDType readXrefSize_1;
  ObjectIDType objectsCount;
  ObjectIDType startObject;
  PDFInteger *segmentValue;
  SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
  segmentsIterator;
  ObjectIDType readXrefSize;
  string local_120;
  undefined1 local_100 [8];
  PDFObjectCastPtr<PDFInteger> xrefSize;
  string local_e8;
  undefined1 local_c8 [8];
  PDFObjectCastPtr<PDFArray> subsectionsIndex;
  PDFObjectCastPtr<PDFInteger> widthObject;
  unsigned_long i;
  string local_98;
  undefined1 local_68 [8];
  PDFObjectCastPtr<PDFArray> wArray;
  RefCountPtr<PDFDictionary> streamDictionary;
  int *widthsArray;
  IByteReader *xrefStreamSource;
  EStatusCode status;
  ObjectIDType *outReadTableSize_local;
  PDFStreamInput *inXrefStream_local;
  ObjectIDType inXrefSize_local;
  XrefEntryInputVector *inXrefTable_local;
  PDFParser *this_local;
  
  xrefStreamSource._4_4_ = eSuccess;
  *outReadTableSize = inXrefSize;
  inReadFrom = CreateInputStreamReader(this,inXrefStream);
  streamDictionary.mValue = (PDFDictionary *)0x0;
  if (inReadFrom == (IByteReader *)0x0) {
    xrefStreamSource._4_4_ = eFailure;
    goto LAB_002597f0;
  }
  pPVar4 = PDFStreamInput::QueryStreamDictionary(inXrefStream);
  this_00 = &wArray.super_RefCountPtr<PDFArray>.mValue;
  RefCountPtr<PDFDictionary>::RefCountPtr((RefCountPtr<PDFDictionary> *)this_00,pPVar4);
  pPVar4 = RefCountPtr<PDFDictionary>::GetPtr((RefCountPtr<PDFDictionary> *)this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"W",(allocator<char> *)((long)&i + 7));
  pPVar5 = QueryDictionaryObject(this,pPVar4,&local_98);
  PDFObjectCastPtr<PDFArray>::PDFObjectCastPtr((PDFObjectCastPtr<PDFArray> *)local_68,pPVar5);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
  bVar2 = RefCountPtr<PDFArray>::operator!((RefCountPtr<PDFArray> *)local_68);
  if (bVar2) {
    pTVar12 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar12,"PDFParser::ParseXrefFromXrefStream, W array not available. failing");
    xrefStreamSource._4_4_ = eFailure;
    i._0_4_ = 2;
  }
  else {
    pPVar6 = RefCountPtr<PDFArray>::operator->((RefCountPtr<PDFArray> *)local_68);
    uVar7 = PDFArray::GetLength(pPVar6);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar7;
    uVar8 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    streamDictionary.mValue = (PDFDictionary *)operator_new__(uVar8);
    widthObject.super_RefCountPtr<PDFInteger>.mValue = (PDFInteger *)0x0;
    while( true ) {
      pPVar6 = RefCountPtr<PDFArray>::operator->((RefCountPtr<PDFArray> *)local_68);
      pPVar9 = (PDFInteger *)PDFArray::GetLength(pPVar6);
      if (pPVar9 <= widthObject.super_RefCountPtr<PDFInteger>.mValue) break;
      pPVar6 = RefCountPtr<PDFArray>::operator->((RefCountPtr<PDFArray> *)local_68);
      pPVar5 = PDFArray::QueryObject
                         (pPVar6,(unsigned_long)widthObject.super_RefCountPtr<PDFInteger>.mValue);
      PDFObjectCastPtr<PDFInteger>::PDFObjectCastPtr
                ((PDFObjectCastPtr<PDFInteger> *)
                 &subsectionsIndex.super_RefCountPtr<PDFArray>.mValue,pPVar5);
      bVar2 = RefCountPtr<PDFInteger>::operator!
                        ((RefCountPtr<PDFInteger> *)
                         &subsectionsIndex.super_RefCountPtr<PDFArray>.mValue);
      if (bVar2) {
        pTVar12 = Trace::DefaultTrace();
        Trace::TraceToLog(pTVar12,
                          "PDFParser::ParseXrefFromXrefStream, wrong items in width array (supposed to have only integers)"
                         );
        xrefStreamSource._4_4_ = eFailure;
        i._0_4_ = 4;
      }
      else {
        pPVar9 = RefCountPtr<PDFInteger>::operator->
                           ((RefCountPtr<PDFInteger> *)
                            &subsectionsIndex.super_RefCountPtr<PDFArray>.mValue);
        lVar10 = PDFInteger::GetValue(pPVar9);
        *(int *)((long)&((streamDictionary.mValue)->super_PDFObject).super_RefCountObject.
                        _vptr_RefCountObject +
                (long)widthObject.super_RefCountPtr<PDFInteger>.mValue * 4) = (int)lVar10;
        i._0_4_ = 0;
      }
      PDFObjectCastPtr<PDFInteger>::~PDFObjectCastPtr
                ((PDFObjectCastPtr<PDFInteger> *)
                 &subsectionsIndex.super_RefCountPtr<PDFArray>.mValue);
      if ((int)i != 0) break;
      widthObject.super_RefCountPtr<PDFInteger>.mValue =
           (PDFInteger *)
           ((long)&((widthObject.super_RefCountPtr<PDFInteger>.mValue)->super_PDFObject).
                   super_RefCountObject._vptr_RefCountObject + 1);
    }
    if (xrefStreamSource._4_4_ == eSuccess) {
      pPVar4 = RefCountPtr<PDFDictionary>::GetPtr
                         ((RefCountPtr<PDFDictionary> *)&wArray.super_RefCountPtr<PDFArray>.mValue);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"Index",
                 (allocator<char> *)((long)&xrefSize.super_RefCountPtr<PDFInteger>.mValue + 7));
      pPVar5 = QueryDictionaryObject(this,pPVar4,&local_e8);
      PDFObjectCastPtr<PDFArray>::PDFObjectCastPtr((PDFObjectCastPtr<PDFArray> *)local_c8,pPVar5);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&xrefSize.super_RefCountPtr<PDFInteger>.mValue + 7));
      inPosition = PDFStreamInput::GetStreamContentStart(inXrefStream);
      MovePositionInStream(this,inPosition);
      bVar2 = RefCountPtr<PDFArray>::operator!((RefCountPtr<PDFArray> *)local_c8);
      if (bVar2) {
        pPVar4 = RefCountPtr<PDFDictionary>::GetPtr
                           ((RefCountPtr<PDFDictionary> *)&wArray.super_RefCountPtr<PDFArray>.mValue
                           );
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,"Size",(allocator<char> *)((long)&readXrefSize + 7));
        pPVar5 = QueryDictionaryObject(this,pPVar4,&local_120);
        PDFObjectCastPtr<PDFInteger>::PDFObjectCastPtr
                  ((PDFObjectCastPtr<PDFInteger> *)local_100,pPVar5);
        std::__cxx11::string::~string((string *)&local_120);
        std::allocator<char>::~allocator((allocator<char> *)((long)&readXrefSize + 7));
        bVar2 = RefCountPtr<PDFInteger>::operator!((RefCountPtr<PDFInteger> *)local_100);
        if (bVar2) {
          pTVar12 = Trace::DefaultTrace();
          Trace::TraceToLog(pTVar12,
                            "PDFParser::ParseXrefFromXrefStream, xref size does not exist for this stream"
                           );
          xrefStreamSource._4_4_ = eFailure;
          i._0_4_ = 2;
        }
        else {
          pPVar9 = RefCountPtr<PDFInteger>::operator->((RefCountPtr<PDFInteger> *)local_100);
          inSegmentCount_00 = (PDFObject **)PDFInteger::GetValue(pPVar9);
          segmentsIterator.
          super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>.
          mCurrentPosition._M_current = inSegmentCount_00;
          if (inXrefSize < inSegmentCount_00) {
            if ((this->mAllowExtendingSegments & 1U) == 0) {
              i._0_4_ = 2;
              goto LAB_00259445;
            }
            *outReadTableSize = (ObjectIDType)inSegmentCount_00;
          }
          pPVar6 = RefCountPtr<PDFArray>::operator->((RefCountPtr<PDFArray> *)local_68);
          uVar7 = PDFArray::GetLength(pPVar6);
          xrefStreamSource._4_4_ =
               ReadXrefStreamSegment
                         (this,inXrefTable,0,(ObjectIDType)inSegmentCount_00,inReadFrom,
                          (int *)streamDictionary.mValue,uVar7);
          i._0_4_ = 0;
        }
LAB_00259445:
        PDFObjectCastPtr<PDFInteger>::~PDFObjectCastPtr((PDFObjectCastPtr<PDFInteger> *)local_100);
        if ((int)i == 0) goto LAB_002597b8;
      }
      else {
        pPVar6 = RefCountPtr<PDFArray>::operator->((RefCountPtr<PDFArray> *)local_c8);
        PDFArray::GetIterator
                  ((SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                    *)&segmentValue,pPVar6);
        inXrefStream_local = (PDFStreamInput *)inXrefSize;
        while (bVar2 = ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>::
                       MoveNext((ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                                 *)&segmentValue), bVar2 && xrefStreamSource._4_4_ == eSuccess) {
          pPVar11 = SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                    ::GetItem((SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                               *)&segmentValue);
          EVar3 = PDFObject::GetType(pPVar11);
          if (EVar3 != ePDFObjectInteger) {
            pTVar12 = Trace::DefaultTrace();
            Trace::TraceToLog(pTVar12,
                              "PDFParser::ParseXrefFromXrefStream, found non integer value in Index array of xref stream"
                             );
            xrefStreamSource._4_4_ = eFailure;
            break;
          }
          startObject = (ObjectIDType)
                        SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                        ::GetItem((SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                                   *)&segmentValue);
          objectsCount = PDFInteger::GetValue((PDFInteger *)startObject);
          bVar2 = ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>::
                  MoveNext((ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                            *)&segmentValue);
          if (!bVar2) {
            pTVar12 = Trace::DefaultTrace();
            Trace::TraceToLog(pTVar12,
                              "PDFParser::ParseXrefFromXrefStream,Index array of xref stream should have an even number of values"
                             );
            xrefStreamSource._4_4_ = eFailure;
            break;
          }
          pPVar11 = SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                    ::GetItem((SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                               *)&segmentValue);
          EVar3 = PDFObject::GetType(pPVar11);
          if (EVar3 != ePDFObjectInteger) {
            pTVar12 = Trace::DefaultTrace();
            Trace::TraceToLog(pTVar12,
                              "PDFParser::ParseXrefFromXrefStream, found non integer value in Index array of xref stream"
                             );
            xrefStreamSource._4_4_ = eFailure;
            break;
          }
          startObject = (ObjectIDType)
                        SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                        ::GetItem((SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                                   *)&segmentValue);
          readXrefSize_1 = PDFInteger::GetValue((PDFInteger *)startObject);
          inSegmentStartObject = objectsCount;
          local_168 = (PDFStreamInput *)(objectsCount + readXrefSize_1);
          if (inXrefStream_local < local_168) {
            if ((this->mAllowExtendingSegments & 1U) == 0) break;
            *outReadTableSize = (ObjectIDType)local_168;
            inXrefStream_local = local_168;
          }
          local_170 = (long)inXrefStream_local - objectsCount;
          puVar13 = std::min<unsigned_long>(&readXrefSize_1,&local_170);
          inSegmentCount = *puVar13;
          pPVar6 = RefCountPtr<PDFArray>::operator->((RefCountPtr<PDFArray> *)local_68);
          uVar7 = PDFArray::GetLength(pPVar6);
          xrefStreamSource._4_4_ =
               ReadXrefStreamSegment
                         (this,inXrefTable,inSegmentStartObject,inSegmentCount,inReadFrom,
                          (int *)streamDictionary.mValue,uVar7);
        }
LAB_002597b8:
        i._0_4_ = 0;
      }
      PDFObjectCastPtr<PDFArray>::~PDFObjectCastPtr((PDFObjectCastPtr<PDFArray> *)local_c8);
    }
    else {
      i._0_4_ = 2;
    }
  }
  PDFObjectCastPtr<PDFArray>::~PDFObjectCastPtr((PDFObjectCastPtr<PDFArray> *)local_68);
  RefCountPtr<PDFDictionary>::~RefCountPtr
            ((RefCountPtr<PDFDictionary> *)&wArray.super_RefCountPtr<PDFArray>.mValue);
LAB_002597f0:
  if (inReadFrom != (IByteReader *)0x0) {
    (*inReadFrom->_vptr_IByteReader[1])();
  }
  if (streamDictionary.mValue != (PDFDictionary *)0x0) {
    operator_delete__(streamDictionary.mValue);
  }
  return xrefStreamSource._4_4_;
}

Assistant:

EStatusCode PDFParser::ParseXrefFromXrefStream(XrefEntryInputVector& inXrefTable,
                                                   ObjectIDType inXrefSize,
                                                   PDFStreamInput* inXrefStream,
                                                   ObjectIDType* outReadTableSize)
{
	// 1. Setup the stream to read from the stream start location
	// 2. Set it up with an input stream to decode if required
	// 3. if there are subsections, loop them, otherwise assume a single section of 0..size
	// 4. for each subsection use the base number as starting, and count as well, to read the stream entries to the right position in the table
	//    The entries are read using the "W" value. make sure to read even values that you don't need.

	EStatusCode status = PDFHummus::eSuccess;

    *outReadTableSize = inXrefSize;

	IByteReader* xrefStreamSource = CreateInputStreamReader(inXrefStream);
	int* widthsArray = NULL;

	do
	{
		if(!xrefStreamSource)
		{
			status = PDFHummus::eFailure;
			break;
		}

		RefCountPtr<PDFDictionary> streamDictionary(inXrefStream->QueryStreamDictionary());

		// setup w array
		PDFObjectCastPtr<PDFArray> wArray(QueryDictionaryObject(streamDictionary.GetPtr(),"W"));
		if(!wArray)
		{
			TRACE_LOG("PDFParser::ParseXrefFromXrefStream, W array not available. failing");
			status = PDFHummus::eFailure;
			break;
		}

		widthsArray = new int[wArray->GetLength()];
		for(unsigned long i=0;i <wArray->GetLength();++i)
		{
			PDFObjectCastPtr<PDFInteger> widthObject(wArray->QueryObject(i));
			if(!widthObject)
			{
				TRACE_LOG("PDFParser::ParseXrefFromXrefStream, wrong items in width array (supposed to have only integers)");
				status = PDFHummus::eFailure;
				break;
			}
			widthsArray[i] = (int)widthObject->GetValue();
		}
		if(status != PDFHummus::eSuccess)
			break;

		// read the segments from the stream
		PDFObjectCastPtr<PDFArray> subsectionsIndex(QueryDictionaryObject(streamDictionary.GetPtr(),"Index"));
		MovePositionInStream(inXrefStream->GetStreamContentStart());

		if(!subsectionsIndex)
		{
			PDFObjectCastPtr<PDFInteger> xrefSize(QueryDictionaryObject(streamDictionary.GetPtr(),"Size"));
			if(!xrefSize)
			{
				TRACE_LOG("PDFParser::ParseXrefFromXrefStream, xref size does not exist for this stream");
				status = PDFHummus::eFailure;
				break;
			}

            // if reading objects past expected range interesting consult policy
            ObjectIDType readXrefSize = (ObjectIDType)xrefSize->GetValue();

            if(readXrefSize > inXrefSize)
            {
                if(mAllowExtendingSegments)
                {
                    inXrefSize = readXrefSize;
                    *outReadTableSize = readXrefSize;
                }
                else
                    break;
            }
			status = ReadXrefStreamSegment(inXrefTable,0,readXrefSize,xrefStreamSource,widthsArray,wArray->GetLength());
		}
		else
		{
			SingleValueContainerIterator<PDFObjectVector> segmentsIterator  = subsectionsIndex->GetIterator();
			PDFInteger* segmentValue;
			while(segmentsIterator.MoveNext() && PDFHummus::eSuccess == status)
			{
				if(segmentsIterator.GetItem()->GetType() != PDFObject::ePDFObjectInteger)
				{
					TRACE_LOG("PDFParser::ParseXrefFromXrefStream, found non integer value in Index array of xref stream");
					status = PDFHummus::eFailure;
					break;
				}
				segmentValue = (PDFInteger*)(segmentsIterator.GetItem());

				ObjectIDType startObject = (ObjectIDType)segmentValue->GetValue();
				if(!segmentsIterator.MoveNext())
				{
					TRACE_LOG("PDFParser::ParseXrefFromXrefStream,Index array of xref stream should have an even number of values");
					status = PDFHummus::eFailure;
					break;
				}

				if(segmentsIterator.GetItem()->GetType() != PDFObject::ePDFObjectInteger)
				{
					TRACE_LOG("PDFParser::ParseXrefFromXrefStream, found non integer value in Index array of xref stream");
					status = PDFHummus::eFailure;
					break;
				}
				segmentValue = (PDFInteger*)(segmentsIterator.GetItem());

				ObjectIDType objectsCount = (ObjectIDType)segmentValue->GetValue();
				ObjectIDType readXrefSize = startObject +  objectsCount;

				// if reading objects past expected range interesting consult policy
				if(readXrefSize > inXrefSize)
                {
                    if(mAllowExtendingSegments)
                    {
                        inXrefSize = readXrefSize;
                        *outReadTableSize = readXrefSize;
                    }
                    else
                        break;
                }
				status = ReadXrefStreamSegment(inXrefTable,startObject,std::min<ObjectIDType>(objectsCount,inXrefSize - startObject),xrefStreamSource,widthsArray,wArray->GetLength());
			}
		}
	}while(false);

	delete xrefStreamSource;
	delete[] widthsArray;
	return status;
}